

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall slang::parsing::Lexer::lexTrivia<false>(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  TriviaKind local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
LAB_003917d4:
  pcVar2 = this->sourceBuffer;
  this->marker = pcVar2;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\t':
  case '\v':
  case '\f':
switchD_003917ef_caseD_9:
    this->sourceBuffer = pcVar2 + 1;
    scanWhitespace(this);
    goto LAB_003917d4;
  case '\n':
    this->sourceBuffer = pcVar2 + 1;
    local_38._M_len = 1;
    break;
  case '\r':
    pcVar3 = pcVar2 + 1;
    this->sourceBuffer = pcVar3;
    if (pcVar2[1] == '\n') {
      pcVar3 = pcVar2 + 2;
      this->sourceBuffer = pcVar3;
    }
    local_38._M_len = (size_t)(uint)((int)pcVar3 - (int)pcVar2);
    break;
  default:
    if (cVar1 != '/') {
      if (cVar1 != ' ') {
        return;
      }
      goto switchD_003917ef_caseD_9;
    }
    if (pcVar2[1] == '*') {
      this->sourceBuffer = pcVar2 + 2;
      scanBlockComment(this);
    }
    else {
      if (pcVar2[1] != '/') {
        return;
      }
      this->sourceBuffer = pcVar2 + 2;
      scanLineComment(this);
    }
    goto LAB_003917d4;
  }
  local_39 = EndOfLine;
  local_38._M_str = pcVar2;
  SmallVectorBase<slang::parsing::Trivia>::
  emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
            (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,&local_39,&local_38
            );
  goto LAB_003917d4;
}

Assistant:

void Lexer::lexTrivia() {
    while (true) {
        mark();

        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                scanWhitespace();
                break;
            case '/':
                switch (peek(1)) {
                    case '/':
                        advance(2);
                        scanLineComment();
                        break;
                    case '*': {
                        advance(2);
                        scanBlockComment();
                        break;
                    }
                    default:
                        return;
                }
                break;
            case '\r':
                advance();
                consume('\n');
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            case '\n':
                advance();
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            default:
                return;
        }
    }
}